

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse2_128_64.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_table_striped_profile_sse2_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  long *plVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  ulong uVar7;
  ushort uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  int iVar12;
  int iVar13;
  parasail_result_t *ppVar14;
  __m128i *ptr;
  __m128i *palVar15;
  __m128i *ptr_00;
  int64_t *ptr_01;
  ulong uVar16;
  __m128i *ptr_02;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  char *pcVar20;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar21;
  uint uVar25;
  ulong uVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  char *__format;
  long lVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  uint uVar36;
  ulong size;
  ulong uVar37;
  ulong uVar38;
  __m128i_64_t _Var39;
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar40 [16];
  undefined1 extraout_XMM0_01 [16];
  int64_t iVar41;
  __m128i_64_t B_4;
  longlong lVar47;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  longlong lVar42;
  longlong lVar48;
  undefined1 auVar46 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar55;
  int iVar62;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int iVar63;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  int iVar73;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  int iVar79;
  int iVar80;
  __m128i_64_t B_6;
  undefined1 auVar74 [16];
  int iVar81;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  int iVar82;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  __m128i_64_t B;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  __m128i_64_t B_1;
  undefined1 auVar91 [16];
  __m128i_64_t _Var92;
  __m128i alVar93;
  __m128i b;
  __m128i b_00;
  __m128i a;
  __m128i a_00;
  __m128i alVar94;
  int local_194;
  undefined1 local_178 [16];
  __m128i_64_t A;
  long lStack_130;
  uint local_110;
  int iStack_10c;
  ulong uStack_80;
  ulong uStack_70;
  __m128i_64_t e;
  __m128i_64_t h;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar20 = "profile";
  }
  else {
    pvVar4 = (profile->profile64).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar20 = "profile->profile64.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar20 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar20 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar20 = "s2";
        }
        else {
          uVar26 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar20 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar20 = "open";
          }
          else {
            if (-1 < gap) {
              uVar25 = uVar3 - 1;
              size = (ulong)uVar3 + 1 >> 1;
              uVar7 = (ulong)uVar25 % size;
              iVar12 = (int)(uVar25 / size) + -1;
              uVar18 = (ulong)(uint)open;
              iVar27 = -open;
              iVar55 = ppVar5->min;
              uVar37 = 0x8000000000000000 - (long)iVar55;
              if (iVar55 != iVar27 && SBORROW4(iVar55,iVar27) == iVar55 + open < 0) {
                uVar37 = uVar18 | 0x8000000000000000;
              }
              iVar55 = ppVar5->max;
              uVar36 = (uint)size;
              ppVar14 = parasail_result_new_table1((uint)((ulong)uVar3 + 1) & 0x7ffffffe,s2Len);
              if (ppVar14 == (parasail_result_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              ppVar14->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar14->flag | 0x2820802;
              ptr = parasail_memalign___m128i(0x10,size);
              palVar15 = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
              auVar78._0_4_ = -(uint)((int)ptr == 0 && (int)((ulong)ptr >> 0x20) == 0);
              auVar78._4_4_ = -(uint)((int)palVar15 == 0 && (int)((ulong)palVar15 >> 0x20) == 0);
              auVar78._8_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
              auVar78._12_4_ = -(uint)((int)ptr_01 == 0 && (int)((ulong)ptr_01 >> 0x20) == 0);
              iVar13 = movmskps((int)ptr_01,auVar78);
              if (iVar13 != 0) {
                return (parasail_result_t *)0x0;
              }
              iVar13 = s2Len + -1;
              uVar2 = -iVar12;
              uVar38 = (ulong)(uint)gap;
              uVar16 = uVar37 + 1;
              lVar22 = 0x7ffffffffffffffe - (long)iVar55;
              _Var39.m[1]._0_4_ = (int)uVar16;
              _Var39.m[0] = uVar16;
              _Var39.m[1]._4_4_ = (int)(uVar16 >> 0x20);
              local_178._8_4_ = (int)lVar22;
              local_178._0_8_ = lVar22;
              local_178._12_4_ = (int)((ulong)lVar22 >> 0x20);
              lVar30 = (long)iVar27;
              lVar22 = lVar30;
              for (uVar23 = 0; uVar23 != size; uVar23 = uVar23 + 1) {
                lVar32 = lVar22;
                for (lVar33 = 0; lVar33 != 2; lVar33 = lVar33 + 1) {
                  lVar34 = lVar32;
                  if (s1_beg != 0) {
                    lVar34 = 0;
                  }
                  *(long *)((long)&h + lVar33 * 8) = lVar34;
                  *(ulong *)((long)&e + lVar33 * 8) = lVar34 - uVar18;
                  lVar32 = lVar32 - size * (uint)gap;
                }
                ptr[uVar23][0] = h.m[0];
                ptr[uVar23][1] = h.m[1];
                ptr_00[uVar23][0] = e.m[0];
                ptr_00[uVar23][1] = e.m[1];
                lVar22 = lVar22 - (ulong)(uint)gap;
              }
              *ptr_01 = 0;
              for (uVar23 = 1; s2Len + 1 != uVar23; uVar23 = uVar23 + 1) {
                iVar55 = 0;
                if (s2_beg == 0) {
                  iVar55 = iVar27;
                }
                ptr_01[uVar23] = (long)iVar55;
                iVar27 = iVar27 - gap;
              }
              lVar22 = size * uVar26 * 4;
              uVar35 = 0;
              uVar24 = (ulong)(uVar36 - 1) * 0x10;
              uVar23 = uVar7 * 0x10;
              uVar29 = 0;
              uVar31 = uVar26;
              local_194 = iVar13;
              A = _Var39;
              do {
                ptr_02 = palVar15;
                if (uVar29 == uVar26) {
                  a_00[0] = (ulong)uVar2;
                  if (s2_end != 0) {
                    uVar23 = 0;
                    while ((int)uVar23 < (int)uVar2) {
                      auVar10._8_8_ = 0;
                      auVar10._0_8_ = A.m[0];
                      A = (__m128i_64_t)(auVar10 << 0x40);
                      uVar23 = 1;
                    }
                    uVar16 = CONCAT44(A.m[0]._4_4_,A.m[1]._0_4_);
                  }
                  uVar28 = uVar25;
                  if (s1_end != 0) {
                    for (uVar23 = 0; (uVar36 & 0x3fffffff) * 2 != (int)uVar23; uVar23 = uVar23 + 1)
                    {
                      uVar31 = uVar23 >> 1 & 0x7fffffff;
                      uVar21 = 0;
                      if ((uVar23 & 1) != 0) {
                        uVar21 = uVar36;
                      }
                      uVar21 = uVar21 + (int)uVar31;
                      uVar24 = (ulong)uVar21;
                      uVar26 = uVar16;
                      iVar55 = local_194;
                      uVar11 = uVar28;
                      if (((int)uVar21 < (int)uVar3) &&
                         (uVar31 = (*ptr)[uVar23], uVar26 = uVar31, iVar55 = iVar13, uVar11 = uVar21
                         , (long)uVar31 <= (long)uVar16)) {
                        if ((int)uVar28 <= (int)uVar21) {
                          uVar21 = uVar28;
                        }
                        if (local_194 != iVar13) {
                          uVar21 = uVar28;
                        }
                        uVar24 = (ulong)uVar21;
                        uVar26 = uVar16;
                        iVar55 = local_194;
                        uVar11 = uVar28;
                        if (uVar31 == uVar16) {
                          uVar11 = uVar21;
                        }
                      }
                      uVar28 = uVar11;
                      local_194 = iVar55;
                      uVar16 = uVar26;
                    }
                  }
                  iVar55 = (int)uVar16;
                  if (s2_end == 0 && s1_end == 0) {
                    uVar23 = 0;
                    lVar47 = ptr[uVar7][0];
                    lVar48 = ptr[uVar7][1];
                    while (lVar42 = lVar47, iVar55 = (int)lVar48, local_194 = iVar13,
                          uVar28 = uVar25, (int)uVar23 < (int)uVar2) {
                      lVar47 = 0;
                      lVar48 = lVar42;
                      uVar23 = 1;
                    }
                  }
                  local_110 = (uint)uVar37;
                  iStack_10c = (int)(uVar37 >> 0x20);
                  b_00[1] = uVar23;
                  b_00[0] = uVar24;
                  a_00[1] = uVar31;
                  _mm_cmpgt_epi64_rpl(a_00,b_00);
                  iVar12 = -(uint)((int)(local_110 ^ 0x80000000) <
                                  (int)(local_178._0_4_ ^ 0x80000000));
                  auVar46._4_4_ = -(uint)(iStack_10c < (int)local_178._4_4_);
                  iVar27 = -(uint)((int)(local_110 ^ 0x80000000) <
                                  (int)(local_178._8_4_ ^ 0x80000000));
                  auVar46._12_4_ = -(uint)(iStack_10c < (int)local_178._12_4_);
                  auVar53._4_4_ = iVar12;
                  auVar53._0_4_ = iVar12;
                  auVar53._8_4_ = iVar27;
                  auVar53._12_4_ = iVar27;
                  auVar61._4_4_ = -(uint)(iStack_10c == local_178._4_4_);
                  auVar61._0_4_ = -(uint)(iStack_10c == local_178._4_4_);
                  auVar61._8_4_ = -(uint)(iStack_10c == local_178._12_4_);
                  auVar61._12_4_ = -(uint)(iStack_10c == local_178._12_4_);
                  auVar46._0_4_ = auVar46._4_4_;
                  auVar46._8_4_ = auVar46._12_4_;
                  auVar54._8_4_ = 0xffffffff;
                  auVar54._0_8_ = 0xffffffffffffffff;
                  auVar54._12_4_ = 0xffffffff;
                  auVar78 = auVar54 ^ (auVar46 | auVar61 & auVar53) | extraout_XMM0_01;
                  if ((((((((((((((((auVar78 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar78 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar78 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar78 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar78 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar78 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar78 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar78 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar78 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar78 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar78 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar78 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar78 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar78 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar78 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar78[0xf] < '\0') {
                    *(byte *)&ppVar14->flag = (byte)ppVar14->flag | 0x40;
                    iVar55 = 0;
                    local_194 = 0;
                    uVar28 = 0;
                  }
                  ppVar14->score = iVar55;
                  ppVar14->end_query = uVar28;
                  ppVar14->end_ref = local_194;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr_02);
                  parasail_free(ptr);
                  return ppVar14;
                }
                iVar55 = ppVar5->mapper[(byte)s2[uVar29]];
                iVar41 = ptr_01[uVar29];
                lVar47 = ptr[uVar36 - 1][0];
                uVar23 = uVar35;
                _Var92 = _Var39;
                for (uVar24 = 0; auVar78 = _DAT_008a1890, uStack_80 = (ulong)(uint)gap,
                    size * 0x10 != uVar24; uVar24 = uVar24 + 0x10) {
                  plVar1 = (long *)((long)pvVar4 + uVar24 + (long)(int)(iVar55 * uVar36) * 0x10);
                  auVar43._0_8_ = iVar41 + *plVar1;
                  auVar43._8_8_ = lVar47 + plVar1[1];
                  auVar50 = *(undefined1 (*) [16])((long)*ptr_00 + uVar24);
                  auVar56 = auVar43 ^ _DAT_008a1890;
                  auVar49 = auVar50 ^ _DAT_008a1890;
                  iVar27 = -(uint)(auVar49._0_4_ < auVar56._0_4_);
                  iVar80 = auVar49._4_4_;
                  auVar64._4_4_ = -(uint)(iVar80 < auVar56._4_4_);
                  iVar73 = -(uint)(auVar49._8_4_ < auVar56._8_4_);
                  iVar82 = auVar49._12_4_;
                  auVar64._12_4_ = -(uint)(iVar82 < auVar56._12_4_);
                  auVar74._4_4_ = iVar27;
                  auVar74._0_4_ = iVar27;
                  auVar74._8_4_ = iVar73;
                  auVar74._12_4_ = iVar73;
                  auVar57._4_4_ = -(uint)(auVar56._4_4_ == iVar80);
                  auVar57._12_4_ = -(uint)(auVar56._12_4_ == iVar82);
                  auVar57._0_4_ = auVar57._4_4_;
                  auVar57._8_4_ = auVar57._12_4_;
                  auVar64._0_4_ = auVar64._4_4_;
                  auVar64._8_4_ = auVar64._12_4_;
                  auVar64 = auVar64 | auVar57 & auVar74;
                  auVar65 = ~auVar64 & auVar50 | auVar43 & auVar64;
                  auVar43 = auVar65 ^ _DAT_008a1890;
                  auVar58 = (undefined1  [16])_Var92 ^ _DAT_008a1890;
                  iVar27 = -(uint)(auVar58._0_4_ < auVar43._0_4_);
                  iVar62 = auVar58._4_4_;
                  iVar79 = -(uint)(iVar62 < auVar43._4_4_);
                  iVar73 = -(uint)(auVar58._8_4_ < auVar43._8_4_);
                  iVar63 = auVar58._12_4_;
                  iVar81 = -(uint)(iVar63 < auVar43._12_4_);
                  auVar83._4_4_ = iVar27;
                  auVar83._0_4_ = iVar27;
                  auVar83._8_4_ = iVar73;
                  auVar83._12_4_ = iVar73;
                  iVar27 = -(uint)(auVar43._4_4_ == iVar62);
                  iVar73 = -(uint)(auVar43._12_4_ == iVar63);
                  auVar85._4_4_ = iVar27;
                  auVar85._0_4_ = iVar27;
                  auVar85._8_4_ = iVar73;
                  auVar85._12_4_ = iVar73;
                  auVar56._4_4_ = iVar79;
                  auVar56._0_4_ = iVar79;
                  auVar56._8_4_ = iVar81;
                  auVar56._12_4_ = iVar81;
                  auVar56 = auVar56 | auVar85 & auVar83;
                  auVar43 = ~auVar56 & (undefined1  [16])_Var92 | auVar65 & auVar56;
                  *(undefined1 (*) [16])((long)*ptr_02 + uVar24) = auVar43;
                  auVar65 = auVar43 ^ auVar78;
                  auVar56 = local_178 ^ auVar78;
                  iVar27 = -(uint)(auVar56._0_4_ < auVar65._0_4_);
                  iVar73 = -(uint)(auVar56._4_4_ < auVar65._4_4_);
                  iVar79 = -(uint)(auVar56._8_4_ < auVar65._8_4_);
                  iVar81 = -(uint)(auVar56._12_4_ < auVar65._12_4_);
                  auVar86._4_4_ = iVar27;
                  auVar86._0_4_ = iVar27;
                  auVar86._8_4_ = iVar79;
                  auVar86._12_4_ = iVar79;
                  auVar66._4_4_ = -(uint)(auVar56._4_4_ == auVar65._4_4_);
                  auVar66._12_4_ = -(uint)(auVar56._12_4_ == auVar65._12_4_);
                  auVar66._0_4_ = auVar66._4_4_;
                  auVar66._8_4_ = auVar66._12_4_;
                  auVar75._4_4_ = iVar73;
                  auVar75._0_4_ = iVar73;
                  auVar75._8_4_ = iVar81;
                  auVar75._12_4_ = iVar81;
                  auVar75 = auVar75 | auVar66 & auVar86;
                  auVar76 = ~auVar75 & auVar43 | local_178 & auVar75;
                  auVar56 = auVar76 ^ auVar78;
                  iVar27 = -(uint)(auVar56._0_4_ < auVar49._0_4_);
                  iVar79 = -(uint)(auVar56._4_4_ < iVar80);
                  iVar73 = -(uint)(auVar56._8_4_ < auVar49._8_4_);
                  iVar81 = -(uint)(auVar56._12_4_ < iVar82);
                  auVar87._4_4_ = iVar27;
                  auVar87._0_4_ = iVar27;
                  auVar87._8_4_ = iVar73;
                  auVar87._12_4_ = iVar73;
                  iVar27 = -(uint)(auVar56._4_4_ == iVar80);
                  iVar73 = -(uint)(auVar56._12_4_ == iVar82);
                  auVar65._4_4_ = iVar27;
                  auVar65._0_4_ = iVar27;
                  auVar65._8_4_ = iVar73;
                  auVar65._12_4_ = iVar73;
                  auVar67._4_4_ = iVar79;
                  auVar67._0_4_ = iVar79;
                  auVar67._8_4_ = iVar81;
                  auVar67._12_4_ = iVar81;
                  auVar67 = auVar67 | auVar65 & auVar87;
                  auVar49 = ~auVar67 & auVar50 | auVar76 & auVar67;
                  auVar56 = auVar49 ^ auVar78;
                  iVar27 = -(uint)(auVar56._0_4_ < auVar58._0_4_);
                  iVar73 = -(uint)(auVar56._4_4_ < iVar62);
                  iVar80 = -(uint)(auVar56._8_4_ < auVar58._8_4_);
                  iVar82 = -(uint)(auVar56._12_4_ < iVar63);
                  auVar84._4_4_ = iVar27;
                  auVar84._0_4_ = iVar27;
                  auVar84._8_4_ = iVar80;
                  auVar84._12_4_ = iVar80;
                  auVar58._4_4_ = -(uint)(auVar56._4_4_ == iVar62);
                  auVar58._12_4_ = -(uint)(auVar56._12_4_ == iVar63);
                  auVar58._0_4_ = auVar58._4_4_;
                  auVar58._8_4_ = auVar58._12_4_;
                  auVar90._4_4_ = iVar73;
                  auVar90._0_4_ = iVar73;
                  auVar90._8_4_ = iVar82;
                  auVar90._12_4_ = iVar82;
                  auVar90 = auVar90 | auVar58 & auVar84;
                  local_178 = ~auVar90 & (undefined1  [16])_Var92 | auVar49 & auVar90;
                  piVar6 = ((ppVar14->field_4).rowcols)->score_row;
                  *(int *)((long)piVar6 + uVar23) = auVar43._0_4_;
                  uVar31 = (long)piVar6 + uVar23;
                  *(int *)(lVar22 + uVar31) = auVar43._8_4_;
                  uStack_70 = (ulong)(uint)open;
                  auVar49._0_8_ = auVar43._0_8_ - uVar18;
                  auVar49._8_8_ = auVar43._8_8_ - uStack_70;
                  auVar89._0_8_ = auVar50._0_8_ - uVar38;
                  auVar89._8_8_ = auVar50._8_8_ - uStack_80;
                  auVar50 = auVar89 ^ auVar78;
                  auVar43 = auVar49 ^ auVar78;
                  iVar27 = -(uint)(auVar43._0_4_ < auVar50._0_4_);
                  iVar80 = auVar43._4_4_;
                  auVar68._4_4_ = -(uint)(iVar80 < auVar50._4_4_);
                  iVar73 = -(uint)(auVar43._8_4_ < auVar50._8_4_);
                  iVar82 = auVar43._12_4_;
                  auVar68._12_4_ = -(uint)(iVar82 < auVar50._12_4_);
                  auVar77._4_4_ = iVar27;
                  auVar77._0_4_ = iVar27;
                  auVar77._8_4_ = iVar73;
                  auVar77._12_4_ = iVar73;
                  auVar76._4_4_ = -(uint)(auVar50._4_4_ == iVar80);
                  auVar76._12_4_ = -(uint)(auVar50._12_4_ == iVar82);
                  auVar76._0_4_ = auVar76._4_4_;
                  auVar76._8_4_ = auVar76._12_4_;
                  auVar68._0_4_ = auVar68._4_4_;
                  auVar68._8_4_ = auVar68._12_4_;
                  auVar68 = auVar68 | auVar76 & auVar77;
                  *(undefined1 (*) [16])((long)*ptr_00 + uVar24) =
                       ~auVar68 & auVar49 | auVar89 & auVar68;
                  auVar91._0_8_ = _Var92.m[0] - uVar38;
                  auVar91._8_8_ = _Var92.m[1] - uStack_80;
                  auVar78 = auVar91 ^ auVar78;
                  iVar27 = -(uint)(auVar43._0_4_ < auVar78._0_4_);
                  auVar50._4_4_ = -(uint)(iVar80 < auVar78._4_4_);
                  iVar73 = -(uint)(auVar43._8_4_ < auVar78._8_4_);
                  auVar50._12_4_ = -(uint)(iVar82 < auVar78._12_4_);
                  auVar69._4_4_ = iVar27;
                  auVar69._0_4_ = iVar27;
                  auVar69._8_4_ = iVar73;
                  auVar69._12_4_ = iVar73;
                  iVar27 = -(uint)(auVar78._4_4_ == iVar80);
                  iVar73 = -(uint)(auVar78._12_4_ == iVar82);
                  auVar59._4_4_ = iVar27;
                  auVar59._0_4_ = iVar27;
                  auVar59._8_4_ = iVar73;
                  auVar59._12_4_ = iVar73;
                  auVar50._0_4_ = auVar50._4_4_;
                  auVar50._8_4_ = auVar50._12_4_;
                  auVar50 = auVar50 | auVar59 & auVar69;
                  _Var92 = (__m128i_64_t)(auVar91 & auVar50 | ~auVar50 & auVar49);
                  plVar1 = (long *)((long)*ptr + uVar24);
                  iVar41 = *plVar1;
                  lVar47 = plVar1[1];
                  uVar23 = uVar23 + uVar26 * 4;
                }
                for (iVar55 = 0; iVar55 != 2; iVar55 = iVar55 + 1) {
                  lVar32 = lVar30;
                  if (s2_beg == 0) {
                    lVar32 = ptr_01[uVar29 + 1] - uVar18;
                  }
                  lStack_130 = _Var92.m[0];
                  uVar17 = uVar35;
                  uVar19 = 0;
                  while (auVar78 = _DAT_008a1890, uVar23 = uVar19 + 0x10,
                        size * 0x10 + 0x10 != uVar23) {
                    auVar50 = *(undefined1 (*) [16])((long)*ptr_02 + uVar19);
                    auVar9._8_8_ = lStack_130;
                    auVar9._0_8_ = lVar32;
                    auVar43 = auVar9 ^ _DAT_008a1890;
                    auVar56 = auVar50 ^ _DAT_008a1890;
                    iVar27 = -(uint)(auVar43._0_4_ < auVar56._0_4_);
                    iVar73 = -(uint)(auVar43._4_4_ < auVar56._4_4_);
                    iVar80 = -(uint)(auVar43._8_4_ < auVar56._8_4_);
                    iVar82 = -(uint)(auVar43._12_4_ < auVar56._12_4_);
                    auVar70._4_4_ = iVar27;
                    auVar70._0_4_ = iVar27;
                    auVar70._8_4_ = iVar80;
                    auVar70._12_4_ = iVar80;
                    auVar51._4_4_ = -(uint)(auVar56._4_4_ == auVar43._4_4_);
                    auVar51._12_4_ = -(uint)(auVar56._12_4_ == auVar43._12_4_);
                    auVar51._0_4_ = auVar51._4_4_;
                    auVar51._8_4_ = auVar51._12_4_;
                    auVar44._4_4_ = iVar73;
                    auVar44._0_4_ = iVar73;
                    auVar44._8_4_ = iVar82;
                    auVar44._12_4_ = iVar82;
                    auVar44 = auVar44 | auVar51 & auVar70;
                    auVar50 = ~auVar44 & auVar9 | auVar50 & auVar44;
                    *(undefined1 (*) [16])((long)*ptr_02 + uVar19) = auVar50;
                    auVar43 = local_178 ^ auVar78;
                    auVar78 = auVar50 ^ auVar78;
                    iVar27 = -(uint)(auVar43._0_4_ < auVar78._0_4_);
                    auVar60._4_4_ = -(uint)(auVar43._4_4_ < auVar78._4_4_);
                    iVar73 = -(uint)(auVar43._8_4_ < auVar78._8_4_);
                    auVar60._12_4_ = -(uint)(auVar43._12_4_ < auVar78._12_4_);
                    auVar71._4_4_ = iVar27;
                    auVar71._0_4_ = iVar27;
                    auVar71._8_4_ = iVar73;
                    auVar71._12_4_ = iVar73;
                    auVar88._4_4_ = -(uint)(auVar43._4_4_ == auVar78._4_4_);
                    auVar88._12_4_ = -(uint)(auVar43._12_4_ == auVar78._12_4_);
                    auVar88._0_4_ = auVar88._4_4_;
                    auVar88._8_4_ = auVar88._12_4_;
                    auVar60._0_4_ = auVar60._4_4_;
                    auVar60._8_4_ = auVar60._12_4_;
                    auVar60 = auVar60 | auVar88 & auVar71;
                    local_178 = local_178 & auVar60 | ~auVar60 & auVar50;
                    piVar6 = ((ppVar14->field_4).rowcols)->score_row;
                    *(int *)((long)piVar6 + uVar17) = auVar50._0_4_;
                    *(int *)(lVar22 + (long)piVar6 + uVar17) = auVar50._8_4_;
                    lVar32 = lVar32 - uVar38;
                    lStack_130 = lStack_130 - uStack_80;
                    alVar93[1] = (longlong)piVar6;
                    alVar93[0] = (long)piVar6 + uVar17;
                    alVar94[1] = uVar31;
                    alVar94[0] = (longlong)ppVar14;
                    _mm_cmpgt_epi64_rpl(alVar94,alVar93);
                    uVar8 = (ushort)(SUB161(extraout_XMM0 >> 7,0) & 1) |
                            (ushort)(SUB161(extraout_XMM0 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(extraout_XMM0 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(extraout_XMM0 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(extraout_XMM0 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(extraout_XMM0 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(extraout_XMM0 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(extraout_XMM0 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(extraout_XMM0 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(extraout_XMM0 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(extraout_XMM0 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(extraout_XMM0 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(extraout_XMM0 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(extraout_XMM0 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(extraout_XMM0 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(extraout_XMM0[0xf] >> 7) << 0xf;
                    uVar24 = (ulong)uVar8;
                    uVar17 = uVar17 + uVar26 * 4;
                    uVar19 = uVar23;
                    if (uVar8 == 0) goto LAB_005625c5;
                  }
                  _Var92.m[1] = lStack_130;
                  _Var92.m[0] = lVar32;
                  uVar23 = uVar19;
                }
LAB_005625c5:
                alVar93 = ptr_02[uVar7];
                b[1] = uVar23;
                b[0] = uVar24;
                a[1] = uVar31;
                a[0] = (longlong)ppVar14;
                alVar94 = _mm_cmpgt_epi64_rpl(a,b);
                uVar24 = alVar94[1];
                auVar40._8_8_ = -(ulong)(iVar12 == 0);
                auVar40._0_8_ = -(ulong)(uVar25 < uVar36);
                auVar40 = extraout_XMM0_00 & auVar40;
                auVar78 = (undefined1  [16])A ^ _DAT_008a1890;
                auVar50 = (undefined1  [16])alVar93 ^ _DAT_008a1890;
                iVar55 = -(uint)(auVar78._0_4_ < auVar50._0_4_);
                iVar73 = -(uint)(auVar78._4_4_ < auVar50._4_4_);
                iVar27 = -(uint)(auVar78._8_4_ < auVar50._8_4_);
                iVar80 = -(uint)(auVar78._12_4_ < auVar50._12_4_);
                auVar72._4_4_ = iVar55;
                auVar72._0_4_ = iVar55;
                auVar72._8_4_ = iVar27;
                auVar72._12_4_ = iVar27;
                iVar55 = -(uint)(auVar50._4_4_ == auVar78._4_4_);
                iVar27 = -(uint)(auVar50._12_4_ == auVar78._12_4_);
                auVar45._4_4_ = iVar55;
                auVar45._0_4_ = iVar55;
                auVar45._8_4_ = iVar27;
                auVar45._12_4_ = iVar27;
                auVar52._4_4_ = iVar73;
                auVar52._0_4_ = iVar73;
                auVar52._8_4_ = iVar80;
                auVar52._12_4_ = iVar80;
                auVar52 = auVar52 | auVar45 & auVar72;
                A = (__m128i_64_t)
                    (~auVar52 & (undefined1  [16])A | (undefined1  [16])alVar93 & auVar52);
                if ((((((((((((((((auVar40 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar40 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar40 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar40 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar40 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar40 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar40 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar40 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar40 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar40 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar40 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar40 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar40[0xf] < '\0') {
                  local_194 = (int)uVar29;
                }
                uVar29 = uVar29 + 1;
                uVar35 = uVar35 + 4;
                palVar15 = ptr;
                ptr = ptr_02;
              } while( true );
            }
            __format = "%s: %s must be >= 0\n";
            pcVar20 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_table_striped_profile_sse2_128_64",pcVar20);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi64_rpl(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi64_rpl(vH, vMaxH));
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}